

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O0

exception exception_create(char *message,char *label,int64_t code,char *stacktrace)

{
  uint64_t uVar1;
  char *in_RCX;
  int64_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  exception ex;
  exception local_8;
  
  local_8 = (exception)malloc(0x30);
  if (local_8 == (exception)0x0) {
    local_8 = (exception)0x0;
  }
  else {
    local_8->message = in_RDI;
    local_8->label = in_RSI;
    local_8->code = in_RDX;
    local_8->stacktrace = in_RCX;
    uVar1 = thread_id_get_current();
    local_8->id = uVar1;
    threading_atomic_ref_count_initialize((threading_atomic_ref_count)0x1283d0);
    LOCK();
    exception_stats.allocations = exception_stats.allocations + 1;
    UNLOCK();
  }
  return local_8;
}

Assistant:

exception exception_create(char *message, char *label, int64_t code, char *stacktrace)
{
	exception ex = malloc(sizeof(struct exception_type));

	if (ex == NULL)
	{
		return NULL;
	}

	ex->message = message;
	ex->label = label;
	ex->code = code;
	ex->stacktrace = stacktrace;
	ex->id = thread_id_get_current();

	threading_atomic_ref_count_initialize(&ex->ref);

	reflect_memory_tracker_allocation(exception_stats);

	return ex;
}